

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O2

void jsoncons::jsonpointer::
     add<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,
               basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value,
               bool create_if_missing,error_code *ec)

{
  pointer pbVar1;
  jsonpointer_errc __e;
  size_t sVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  pointer pbVar6;
  type tVar7;
  array_range_type aVar8;
  size_t index;
  pointer local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  string_view_type local_40;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  pbVar6 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    do {
      if (pbVar6 == pbVar1) {
        bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                          (root);
        if (bVar3) {
          if ((buffer._M_string_length == 1) && (*buffer._M_dataplus._M_p == '-')) {
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            emplace_back<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                      ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       root,value);
            sVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                              (root);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                      (root,sVar4 - 1);
            goto LAB_00387031;
          }
          index = 0;
          tVar7 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                            (buffer._M_dataplus._M_p,buffer._M_string_length,&index);
          sVar4 = index;
          if (tVar7.ec == success) {
            sVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                              (root);
            sVar2 = index;
            if (sVar4 <= sVar5) {
              sVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                      size(root);
              if (sVar2 == sVar4) {
                basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                emplace_back<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                          ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            *)root,value);
                sVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                        size(root);
                basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                          (root,sVar4 - 1);
              }
              else {
                aVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                        array_range(root);
                basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                insert<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                          ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                            *)root,aVar8.first_._M_current._M_current + index,value);
              }
              goto LAB_00387031;
            }
            __e = index_exceeds_array_size;
          }
          else {
            __e = invalid_index;
          }
        }
        else {
          bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                  is_object(root);
          if (bVar3) {
            local_40._M_len = buffer._M_string_length;
            local_40._M_str = buffer._M_dataplus._M_p;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)&index,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       root,&local_40,value);
            goto LAB_00387031;
          }
          __e = expected_object_or_array;
        }
        std::error_code::operator=(ec,__e);
        goto LAB_00387031;
      }
      std::__cxx11::string::_M_assign((string *)&buffer);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 == pbVar1);
    index = buffer._M_string_length;
    local_70 = buffer._M_dataplus._M_p;
    root = detail::
           resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                     (root,(string_view_type *)&index,create_if_missing,ec);
  } while (ec->_M_value == 0);
LAB_00387031:
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

void add(Json& root, 
             const basic_json_pointer<typename Json::char_type>& location, 
             T&& value, 
             bool create_if_missing,
             std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();
        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, create_if_missing, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                current->emplace_back(std::forward<T>(value));
                current = std::addressof(current->at(current->size()-1));
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index > current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                if (index == current->size())
                {
                    current->emplace_back(std::forward<T>(value));
                    current = std::addressof(current->at(current->size()-1));
                }
                else
                {
                    auto it2 = current->insert(current->array_range().begin()+index,std::forward<T>(value));
                    current = std::addressof(*it2);
                }
            }
        }
        else if (current->is_object())
        {
            auto r = current->insert_or_assign(buffer,std::forward<T>(value));
            current = std::addressof(r.first->value());
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }